

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O1

int boost::xpressive::detail::
    toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (char **begin,char *end,
              regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,int radix,int max)

{
  int iVar1;
  int iVar2;
  char_type *pcVar3;
  
  pcVar3 = *begin;
  if (pcVar3 == end) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar1 = cpp_regex_traits<char>::value(&tr->super_cpp_regex_traits<char>,*pcVar3,radix);
      if (iVar1 == -1) {
        return iVar2;
      }
      iVar2 = iVar1 + iVar2 * radix;
      if (max < iVar2) {
        return iVar2 / radix;
      }
      pcVar3 = *begin + 1;
      *begin = pcVar3;
    } while (pcVar3 != end);
  }
  return iVar2;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}